

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

char * cmdlineparse(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  undefined8 *puVar3;
  int i;
  int iVar4;
  allocator local_59;
  int local_58;
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = 0;
  local_54 = argc;
  for (iVar4 = 1; iVar4 < local_54; iVar4 = iVar4 + 1) {
    std::__cxx11::string::string((string *)&local_50,argv[iVar4],&local_59);
    bVar2 = std::operator==(&local_50,"--quiet");
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) {
      console.loglevel = 2;
      iVar1 = local_58;
    }
    else {
      std::__cxx11::string::string((string *)&local_50,argv[iVar4],&local_59);
      bVar2 = std::operator==(&local_50,"--preview");
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) {
        opt_preview = true;
        iVar1 = local_58;
      }
      else {
        std::__cxx11::string::string((string *)&local_50,argv[iVar4],&local_59);
        bVar2 = std::operator==(&local_50,"--albedo");
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar2) {
          opt_albedo = true;
          iVar1 = local_58;
        }
        else {
          std::__cxx11::string::string((string *)&local_50,argv[iVar4],&local_59);
          bVar2 = std::operator==(&local_50,"--normal");
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar2) {
            opt_normal = true;
            iVar1 = local_58;
          }
          else {
            std::__cxx11::string::string((string *)&local_50,argv[iVar4],&local_59);
            bVar2 = std::operator==(&local_50,"--spp");
            std::__cxx11::string::~string((string *)&local_50);
            iVar1 = iVar4;
            if (bVar2) {
              opt_spp = atoi(argv[(long)iVar4 + 1]);
              iVar4 = iVar4 + 1;
              iVar1 = local_58;
            }
          }
        }
      }
    }
    local_58 = iVar1;
  }
  if (local_58 == 0) {
    github111116::ConsoleLogger::info<char[7],char*,char[23]>
              (&console,(char (*) [7])"Usage:",argv,(char (*) [23])"[options] <scene json>");
    github111116::ConsoleLogger::log<char[9]>(&console,(char (*) [9])"Options:");
    github111116::ConsoleLogger::log<char[49]>
              (&console,(char (*) [49])"  --quiet          Only show warnings and errors");
    github111116::ConsoleLogger::log<char[45]>
              (&console,(char (*) [45])"  --preview        Render with lower quality");
    github111116::ConsoleLogger::log<char[51]>
              (&console,(char (*) [51])"  --spp <n>        Render with n samples per pixel");
    github111116::ConsoleLogger::log<char[61]>
              (&console,(char (*) [61])
                        "  --albedo         Output albedo buffer to albedo-[filename]");
    github111116::ConsoleLogger::log<char[61]>
              (&console,(char (*) [61])
                        "  --normal         Output normal buffer to normal-[filename]");
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "scene not specified.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  return argv[local_58];
}

Assistant:

const char* cmdlineparse(int argc, char* argv[]) {
#ifndef NDEBUG
	console.warn("Running in DEBUG mode. EXTREMELY SLOW!\n");
#endif
	int fileno = 0;
	for (int i=1; i<argc; ++i) {
		if (std::string(argv[i]) == "--quiet")
			console.loglevel = 2;
		else if (std::string(argv[i]) == "--preview")
			opt_preview = true;
		else if (std::string(argv[i]) == "--albedo")
			opt_albedo = true;
		else if (std::string(argv[i]) == "--normal")
			opt_normal = true;
		else if (std::string(argv[i]) == "--spp")
			opt_spp = atoi(argv[++i]);
		else {
			fileno = i;
		}
	}
	if (!fileno) {
		console.info("Usage:", argv[0], "[options] <scene json>");
		console.log ("Options:");
		console.log ("  --quiet          Only show warnings and errors");
		console.log ("  --preview        Render with lower quality");
		console.log ("  --spp <n>        Render with n samples per pixel");
		console.log ("  --albedo         Output albedo buffer to albedo-[filename]");
		console.log ("  --normal         Output normal buffer to normal-[filename]");
		throw "scene not specified.";
	}
	return argv[fileno];
}